

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col,float rounding,ImDrawCornerFlags rounding_corners)

{
  int iVar1;
  
  if (0xffffff < col) {
    if (0.0 < rounding && (rounding_corners & 0xfU) != 0) {
      iVar1 = (this->_TextureIdStack).Size;
      if (iVar1 != 0) {
        if (iVar1 < 1) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
        }
        if ((this->_TextureIdStack).Data[(long)(this->_TextureIdStack).Size + -1] == user_texture_id
           ) {
          iVar1 = (this->VtxBuffer).Size;
          PathRect(this,p_min,p_max,rounding,rounding_corners);
          AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
          (this->_Path).Size = 0;
          ImGui::ShadeVertsLinearUV
                    (this,iVar1,(this->VtxBuffer).Size,p_min,p_max,uv_min,uv_max,true);
          return;
        }
      }
      PushTextureID(this,user_texture_id);
      iVar1 = (this->VtxBuffer).Size;
      PathRect(this,p_min,p_max,rounding,rounding_corners);
      AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
      (this->_Path).Size = 0;
      ImGui::ShadeVertsLinearUV(this,iVar1,(this->VtxBuffer).Size,p_min,p_max,uv_min,uv_max,true);
      PopTextureID(this);
      return;
    }
    AddImage(this,user_texture_id,p_min,p_max,uv_min,uv_max,col);
  }
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col, float rounding, ImDrawCornerFlags rounding_corners)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (rounding <= 0.0f || (rounding_corners & ImDrawCornerFlags_All) == 0)
    {
        AddImage(user_texture_id, p_min, p_max, uv_min, uv_max, col);
        return;
    }

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(p_min, p_max, rounding, rounding_corners);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(this, vert_start_idx, vert_end_idx, p_min, p_max, uv_min, uv_max, true);

    if (push_texture_id)
        PopTextureID();
}